

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeString(Parser *this,string *output,ErrorMaker error)

{
  TokenType TVar1;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_STRING) {
    io::Tokenizer::ParseString(&(this->input_->current_).text,output);
    while( true ) {
      io::Tokenizer::Next(this->input_);
      if ((this->input_->current_).type != TYPE_STRING) break;
      io::Tokenizer::ParseStringAppend(&(this->input_->current_).text,output);
    }
  }
  else {
    RecordError(this,error);
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool Parser::ConsumeString(std::string* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    io::Tokenizer::ParseString(input_->current().text, output);
    input_->Next();
    // Allow C++ like concatenation of adjacent string tokens.
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(input_->current().text, output);
      input_->Next();
    }
    return true;
  } else {
    RecordError(error);
    return false;
  }
}